

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86.cpp
# Opt level: O2

int __thiscall ncnn::Mish_x86::forward_inplace(Mish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  long lVar8;
  undefined1 (*pauVar9) [16];
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  v4sf one;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  
  auVar1 = _DAT_004f03c0;
  uVar2 = bottom_top_blob->c;
  uVar11 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
  if (bottom_top_blob->elempack == 4) {
    uVar7 = 0;
    uVar12 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar12 = uVar7;
    }
    uVar15 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar15 = uVar7;
    }
    for (; uVar7 != uVar15; uVar7 = uVar7 + 1) {
      pauVar9 = (undefined1 (*) [16])
                (bottom_top_blob->cstep * uVar7 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      uVar10 = uVar12;
      while (iVar13 = (int)uVar10, uVar10 = (ulong)(iVar13 - 1), iVar13 != 0) {
        auVar21 = *pauVar9;
        auVar16 = minps(auVar21,_DAT_004f03b0);
        auVar16 = maxps(auVar16,auVar1);
        fVar29 = auVar16._0_4_ * 1.442695 + 0.5;
        fVar30 = auVar16._4_4_ * 1.442695 + 0.5;
        fVar31 = auVar16._8_4_ * 1.442695 + 0.5;
        fVar32 = auVar16._12_4_ * 1.442695 + 0.5;
        fVar25 = (float)(int)fVar29;
        fVar26 = (float)(int)fVar30;
        fVar27 = (float)(int)fVar31;
        fVar28 = (float)(int)fVar32;
        fVar25 = fVar25 - (float)(-(uint)(fVar29 < fVar25) & 0x3f800000);
        fVar26 = fVar26 - (float)(-(uint)(fVar30 < fVar26) & 0x3f800000);
        fVar27 = fVar27 - (float)(-(uint)(fVar31 < fVar27) & 0x3f800000);
        fVar28 = fVar28 - (float)(-(uint)(fVar32 < fVar28) & 0x3f800000);
        fVar29 = auVar16._0_4_ - fVar25 * 0.6931472;
        fVar30 = auVar16._4_4_ - fVar26 * 0.6931472;
        fVar31 = auVar16._8_4_ - fVar27 * 0.6931472;
        fVar32 = auVar16._12_4_ - fVar28 * 0.6931472;
        auVar33._0_4_ =
             (float)((int)fVar25 * 0x800000 + 0x3f800000) *
             (fVar29 + 1.0 +
             (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
               0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5) * fVar29 * fVar29) + 1.0;
        auVar33._4_4_ =
             (float)((int)fVar26 * 0x800000 + 0x3f800000) *
             (fVar30 + 1.0 +
             (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 + 0.008333452) * fVar30 +
               0.041665796) * fVar30 + 0.16666666) * fVar30 + 0.5) * fVar30 * fVar30) + 1.0;
        auVar33._8_4_ =
             (float)((int)fVar27 * 0x800000 + 0x3f800000) *
             (fVar31 + 1.0 +
             (((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
               0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5) * fVar31 * fVar31) + 1.0;
        auVar33._12_4_ =
             (float)((int)fVar28 * 0x800000 + 0x3f800000) *
             (fVar32 + 1.0 +
             (((((fVar32 * 0.00019875691 + 0.0013981999) * fVar32 + 0.008333452) * fVar32 +
               0.041665796) * fVar32 + 0.16666666) * fVar32 + 0.5) * fVar32 * fVar32) + 1.0;
        auVar16 = maxps(auVar33,_DAT_004f0460);
        fVar29 = (float)(auVar16._0_4_ & 0x807fffff | 0x3f000000);
        fVar31 = (float)(auVar16._4_4_ & 0x807fffff | 0x3f000000);
        fVar25 = (float)(auVar16._8_4_ & 0x807fffff | 0x3f000000);
        fVar27 = (float)(auVar16._12_4_ & 0x807fffff | 0x3f000000);
        fVar30 = fVar29 + -1.0 + (float)(-(uint)(fVar29 < 0.70710677) & (uint)fVar29);
        fVar32 = fVar31 + -1.0 + (float)(-(uint)(fVar31 < 0.70710677) & (uint)fVar31);
        fVar26 = fVar25 + -1.0 + (float)(-(uint)(fVar25 < 0.70710677) & (uint)fVar25);
        fVar28 = fVar27 + -1.0 + (float)(-(uint)(fVar27 < 0.70710677) & (uint)fVar27);
        auVar19._0_4_ =
             ~-(uint)(auVar33._0_4_ <= 0.0) &
             (uint)((((float)(int)((auVar16._0_4_ >> 0x17) - 0x7e) -
                     (float)(-(uint)(fVar29 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar30 +
                    (((((((((fVar30 * 0.070376836 + -0.1151461) * fVar30 + 0.116769984) * fVar30 +
                          -0.12420141) * fVar30 + 0.14249323) * fVar30 + -0.16668057) * fVar30 +
                       0.20000714) * fVar30 + -0.24999994) * fVar30 + 0.3333333) * fVar30 + -0.5) *
                    fVar30 * fVar30) * -2.0);
        auVar19._4_4_ =
             ~-(uint)(auVar33._4_4_ <= 0.0) &
             (uint)((((float)(int)((auVar16._4_4_ >> 0x17) - 0x7e) -
                     (float)(-(uint)(fVar31 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar32 +
                    (((((((((fVar32 * 0.070376836 + -0.1151461) * fVar32 + 0.116769984) * fVar32 +
                          -0.12420141) * fVar32 + 0.14249323) * fVar32 + -0.16668057) * fVar32 +
                       0.20000714) * fVar32 + -0.24999994) * fVar32 + 0.3333333) * fVar32 + -0.5) *
                    fVar32 * fVar32) * -2.0);
        auVar19._8_4_ =
             ~-(uint)(auVar33._8_4_ <= 0.0) &
             (uint)((((float)(int)((auVar16._8_4_ >> 0x17) - 0x7e) -
                     (float)(-(uint)(fVar25 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar26 +
                    (((((((((fVar26 * 0.070376836 + -0.1151461) * fVar26 + 0.116769984) * fVar26 +
                          -0.12420141) * fVar26 + 0.14249323) * fVar26 + -0.16668057) * fVar26 +
                       0.20000714) * fVar26 + -0.24999994) * fVar26 + 0.3333333) * fVar26 + -0.5) *
                    fVar26 * fVar26) * -2.0);
        auVar19._12_4_ =
             ~-(uint)(auVar33._12_4_ <= 0.0) &
             (uint)((((float)(int)((auVar16._12_4_ >> 0x17) - 0x7e) -
                     (float)(-(uint)(fVar27 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar28 +
                    (((((((((fVar28 * 0.070376836 + -0.1151461) * fVar28 + 0.116769984) * fVar28 +
                          -0.12420141) * fVar28 + 0.14249323) * fVar28 + -0.16668057) * fVar28 +
                       0.20000714) * fVar28 + -0.24999994) * fVar28 + 0.3333333) * fVar28 + -0.5) *
                    fVar28 * fVar28) * -2.0);
        auVar17._0_8_ =
             CONCAT44(-(uint)(auVar33._4_4_ <= 0.0),-(uint)(auVar33._0_4_ <= 0.0)) &
             0x7fffffff7fffffff;
        auVar17._8_4_ = -(uint)(auVar33._8_4_ <= 0.0) & 0x7fffffff;
        auVar17._12_4_ = -(uint)(auVar33._12_4_ <= 0.0) & 0x7fffffff;
        auVar16 = minps(auVar17 | auVar19,_DAT_004f03b0);
        auVar16 = maxps(auVar16,auVar1);
        fVar29 = auVar16._0_4_ * 1.442695 + 0.5;
        fVar30 = auVar16._4_4_ * 1.442695 + 0.5;
        fVar31 = auVar16._8_4_ * 1.442695 + 0.5;
        fVar32 = auVar16._12_4_ * 1.442695 + 0.5;
        fVar25 = (float)(int)fVar29;
        fVar26 = (float)(int)fVar30;
        fVar27 = (float)(int)fVar31;
        fVar28 = (float)(int)fVar32;
        fVar25 = fVar25 - (float)(-(uint)(fVar29 < fVar25) & 0x3f800000);
        fVar26 = fVar26 - (float)(-(uint)(fVar30 < fVar26) & 0x3f800000);
        fVar27 = fVar27 - (float)(-(uint)(fVar31 < fVar27) & 0x3f800000);
        fVar28 = fVar28 - (float)(-(uint)(fVar32 < fVar28) & 0x3f800000);
        fVar29 = auVar16._0_4_ - fVar25 * 0.6931472;
        fVar30 = auVar16._4_4_ - fVar26 * 0.6931472;
        fVar31 = auVar16._8_4_ - fVar27 * 0.6931472;
        fVar32 = auVar16._12_4_ - fVar28 * 0.6931472;
        auVar18._0_4_ =
             fVar29 + 1.0 +
             (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
               0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5) * fVar29 * fVar29;
        auVar18._4_4_ =
             fVar30 + 1.0 +
             (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 + 0.008333452) * fVar30 +
               0.041665796) * fVar30 + 0.16666666) * fVar30 + 0.5) * fVar30 * fVar30;
        auVar18._8_4_ =
             fVar31 + 1.0 +
             (((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
               0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5) * fVar31 * fVar31;
        auVar18._12_4_ =
             fVar32 + 1.0 +
             (((((fVar32 * 0.00019875691 + 0.0013981999) * fVar32 + 0.008333452) * fVar32 +
               0.041665796) * fVar32 + 0.16666666) * fVar32 + 0.5) * fVar32 * fVar32;
        fVar25 = (float)((int)fVar25 * 0x800000 + 0x3f800000) * auVar18._0_4_ + 1.0;
        fVar26 = (float)((int)fVar26 * 0x800000 + 0x3f800000) * auVar18._4_4_ + 1.0;
        fVar27 = (float)((int)fVar27 * 0x800000 + 0x3f800000) * auVar18._8_4_ + 1.0;
        fVar28 = (float)((int)fVar28 * 0x800000 + 0x3f800000) * auVar18._12_4_ + 1.0;
        auVar6._4_4_ = fVar26;
        auVar6._0_4_ = fVar25;
        auVar6._8_4_ = fVar27;
        auVar6._12_4_ = fVar28;
        auVar16 = rcpps(auVar18,auVar6);
        fVar29 = auVar16._0_4_;
        fVar30 = auVar16._4_4_;
        fVar31 = auVar16._8_4_;
        fVar32 = auVar16._12_4_;
        auVar20._0_4_ =
             (fVar29 + fVar29 + -1.0 + (2.0 - fVar25 * (fVar29 + fVar29)) * fVar29) * auVar21._0_4_;
        auVar20._4_4_ =
             (fVar30 + fVar30 + -1.0 + (2.0 - fVar26 * (fVar30 + fVar30)) * fVar30) * auVar21._4_4_;
        auVar20._8_4_ =
             (fVar31 + fVar31 + -1.0 + (2.0 - fVar27 * (fVar31 + fVar31)) * fVar31) * auVar21._8_4_;
        auVar20._12_4_ =
             (fVar32 + fVar32 + -1.0 + (2.0 - fVar28 * (fVar32 + fVar32)) * fVar32) * auVar21._12_4_
        ;
        *pauVar9 = auVar20;
        pauVar9 = pauVar9 + 1;
      }
    }
  }
  else {
    uVar7 = 0;
    uVar12 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar12 = uVar7;
    }
    for (; uVar7 != uVar12; uVar7 = uVar7 + 1) {
      pvVar3 = bottom_top_blob->data;
      sVar4 = bottom_top_blob->elemsize;
      sVar5 = bottom_top_blob->cstep;
      pauVar9 = (undefined1 (*) [16])(sVar5 * uVar7 * sVar4 + (long)pvVar3);
      lVar14 = 0;
      for (iVar13 = 0; iVar13 + 3 < (int)uVar11; iVar13 = iVar13 + 4) {
        auVar1 = *pauVar9;
        auVar21 = minps(auVar1,_DAT_004f03b0);
        auVar21 = maxps(auVar21,_DAT_004f03c0);
        fVar29 = auVar21._0_4_ * 1.442695 + 0.5;
        fVar30 = auVar21._4_4_ * 1.442695 + 0.5;
        fVar31 = auVar21._8_4_ * 1.442695 + 0.5;
        fVar32 = auVar21._12_4_ * 1.442695 + 0.5;
        fVar25 = (float)(int)fVar29;
        fVar26 = (float)(int)fVar30;
        fVar27 = (float)(int)fVar31;
        fVar28 = (float)(int)fVar32;
        fVar25 = fVar25 - (float)(-(uint)(fVar29 < fVar25) & 0x3f800000);
        fVar26 = fVar26 - (float)(-(uint)(fVar30 < fVar26) & 0x3f800000);
        fVar27 = fVar27 - (float)(-(uint)(fVar31 < fVar27) & 0x3f800000);
        fVar28 = fVar28 - (float)(-(uint)(fVar32 < fVar28) & 0x3f800000);
        fVar29 = auVar21._0_4_ - fVar25 * 0.6931472;
        fVar30 = auVar21._4_4_ - fVar26 * 0.6931472;
        fVar31 = auVar21._8_4_ - fVar27 * 0.6931472;
        fVar32 = auVar21._12_4_ - fVar28 * 0.6931472;
        auVar23._0_4_ =
             (float)((int)fVar25 * 0x800000 + 0x3f800000) *
             (fVar29 + 1.0 +
             (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
               0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5) * fVar29 * fVar29) + 1.0;
        auVar23._4_4_ =
             (float)((int)fVar26 * 0x800000 + 0x3f800000) *
             (fVar30 + 1.0 +
             (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 + 0.008333452) * fVar30 +
               0.041665796) * fVar30 + 0.16666666) * fVar30 + 0.5) * fVar30 * fVar30) + 1.0;
        auVar23._8_4_ =
             (float)((int)fVar27 * 0x800000 + 0x3f800000) *
             (fVar31 + 1.0 +
             (((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
               0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5) * fVar31 * fVar31) + 1.0;
        auVar23._12_4_ =
             (float)((int)fVar28 * 0x800000 + 0x3f800000) *
             (fVar32 + 1.0 +
             (((((fVar32 * 0.00019875691 + 0.0013981999) * fVar32 + 0.008333452) * fVar32 +
               0.041665796) * fVar32 + 0.16666666) * fVar32 + 0.5) * fVar32 * fVar32) + 1.0;
        auVar21 = maxps(auVar23,_DAT_004f0460);
        fVar29 = (float)(auVar21._0_4_ & 0x807fffff | 0x3f000000);
        fVar31 = (float)(auVar21._4_4_ & 0x807fffff | 0x3f000000);
        fVar25 = (float)(auVar21._8_4_ & 0x807fffff | 0x3f000000);
        fVar27 = (float)(auVar21._12_4_ & 0x807fffff | 0x3f000000);
        fVar30 = fVar29 + -1.0 + (float)(-(uint)(fVar29 < 0.70710677) & (uint)fVar29);
        fVar32 = fVar31 + -1.0 + (float)(-(uint)(fVar31 < 0.70710677) & (uint)fVar31);
        fVar26 = fVar25 + -1.0 + (float)(-(uint)(fVar25 < 0.70710677) & (uint)fVar25);
        fVar28 = fVar27 + -1.0 + (float)(-(uint)(fVar27 < 0.70710677) & (uint)fVar27);
        auVar24._0_4_ =
             ~-(uint)(auVar23._0_4_ <= 0.0) &
             (uint)((((float)(int)((auVar21._0_4_ >> 0x17) - 0x7e) -
                     (float)(-(uint)(fVar29 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar30 +
                    (((((((((fVar30 * 0.070376836 + -0.1151461) * fVar30 + 0.116769984) * fVar30 +
                          -0.12420141) * fVar30 + 0.14249323) * fVar30 + -0.16668057) * fVar30 +
                       0.20000714) * fVar30 + -0.24999994) * fVar30 + 0.3333333) * fVar30 + -0.5) *
                    fVar30 * fVar30) * -2.0);
        auVar24._4_4_ =
             ~-(uint)(auVar23._4_4_ <= 0.0) &
             (uint)((((float)(int)((auVar21._4_4_ >> 0x17) - 0x7e) -
                     (float)(-(uint)(fVar31 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar32 +
                    (((((((((fVar32 * 0.070376836 + -0.1151461) * fVar32 + 0.116769984) * fVar32 +
                          -0.12420141) * fVar32 + 0.14249323) * fVar32 + -0.16668057) * fVar32 +
                       0.20000714) * fVar32 + -0.24999994) * fVar32 + 0.3333333) * fVar32 + -0.5) *
                    fVar32 * fVar32) * -2.0);
        auVar24._8_4_ =
             ~-(uint)(auVar23._8_4_ <= 0.0) &
             (uint)((((float)(int)((auVar21._8_4_ >> 0x17) - 0x7e) -
                     (float)(-(uint)(fVar25 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar26 +
                    (((((((((fVar26 * 0.070376836 + -0.1151461) * fVar26 + 0.116769984) * fVar26 +
                          -0.12420141) * fVar26 + 0.14249323) * fVar26 + -0.16668057) * fVar26 +
                       0.20000714) * fVar26 + -0.24999994) * fVar26 + 0.3333333) * fVar26 + -0.5) *
                    fVar26 * fVar26) * -2.0);
        auVar24._12_4_ =
             ~-(uint)(auVar23._12_4_ <= 0.0) &
             (uint)((((float)(int)((auVar21._12_4_ >> 0x17) - 0x7e) -
                     (float)(-(uint)(fVar27 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar28 +
                    (((((((((fVar28 * 0.070376836 + -0.1151461) * fVar28 + 0.116769984) * fVar28 +
                          -0.12420141) * fVar28 + 0.14249323) * fVar28 + -0.16668057) * fVar28 +
                       0.20000714) * fVar28 + -0.24999994) * fVar28 + 0.3333333) * fVar28 + -0.5) *
                    fVar28 * fVar28) * -2.0);
        auVar16._0_8_ =
             CONCAT44(-(uint)(auVar23._4_4_ <= 0.0),-(uint)(auVar23._0_4_ <= 0.0)) &
             0x7fffffff7fffffff;
        auVar16._8_4_ = -(uint)(auVar23._8_4_ <= 0.0) & 0x7fffffff;
        auVar16._12_4_ = -(uint)(auVar23._12_4_ <= 0.0) & 0x7fffffff;
        auVar21 = minps(auVar16 | auVar24,_DAT_004f03b0);
        auVar21 = maxps(auVar21,_DAT_004f03c0);
        fVar29 = auVar21._0_4_ * 1.442695 + 0.5;
        fVar30 = auVar21._4_4_ * 1.442695 + 0.5;
        fVar31 = auVar21._8_4_ * 1.442695 + 0.5;
        fVar32 = auVar21._12_4_ * 1.442695 + 0.5;
        fVar25 = (float)(int)fVar29;
        fVar26 = (float)(int)fVar30;
        fVar27 = (float)(int)fVar31;
        fVar28 = (float)(int)fVar32;
        fVar25 = fVar25 - (float)(-(uint)(fVar29 < fVar25) & 0x3f800000);
        fVar26 = fVar26 - (float)(-(uint)(fVar30 < fVar26) & 0x3f800000);
        fVar27 = fVar27 - (float)(-(uint)(fVar31 < fVar27) & 0x3f800000);
        fVar28 = fVar28 - (float)(-(uint)(fVar32 < fVar28) & 0x3f800000);
        fVar29 = auVar21._0_4_ - fVar25 * 0.6931472;
        fVar30 = auVar21._4_4_ - fVar26 * 0.6931472;
        fVar31 = auVar21._8_4_ - fVar27 * 0.6931472;
        fVar32 = auVar21._12_4_ - fVar28 * 0.6931472;
        auVar22._0_4_ =
             fVar29 + 1.0 +
             (((((fVar29 * 0.00019875691 + 0.0013981999) * fVar29 + 0.008333452) * fVar29 +
               0.041665796) * fVar29 + 0.16666666) * fVar29 + 0.5) * fVar29 * fVar29;
        auVar22._4_4_ =
             fVar30 + 1.0 +
             (((((fVar30 * 0.00019875691 + 0.0013981999) * fVar30 + 0.008333452) * fVar30 +
               0.041665796) * fVar30 + 0.16666666) * fVar30 + 0.5) * fVar30 * fVar30;
        auVar22._8_4_ =
             fVar31 + 1.0 +
             (((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
               0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5) * fVar31 * fVar31;
        auVar22._12_4_ =
             fVar32 + 1.0 +
             (((((fVar32 * 0.00019875691 + 0.0013981999) * fVar32 + 0.008333452) * fVar32 +
               0.041665796) * fVar32 + 0.16666666) * fVar32 + 0.5) * fVar32 * fVar32;
        fVar25 = (float)((int)fVar25 * 0x800000 + 0x3f800000) * auVar22._0_4_ + 1.0;
        fVar26 = (float)((int)fVar26 * 0x800000 + 0x3f800000) * auVar22._4_4_ + 1.0;
        fVar27 = (float)((int)fVar27 * 0x800000 + 0x3f800000) * auVar22._8_4_ + 1.0;
        fVar28 = (float)((int)fVar28 * 0x800000 + 0x3f800000) * auVar22._12_4_ + 1.0;
        auVar21._4_4_ = fVar26;
        auVar21._0_4_ = fVar25;
        auVar21._8_4_ = fVar27;
        auVar21._12_4_ = fVar28;
        auVar21 = rcpps(auVar22,auVar21);
        fVar29 = auVar21._0_4_;
        fVar30 = auVar21._4_4_;
        fVar31 = auVar21._8_4_;
        fVar32 = auVar21._12_4_;
        *(float *)*pauVar9 =
             (fVar29 + fVar29 + -1.0 + (2.0 - fVar25 * (fVar29 + fVar29)) * fVar29) * auVar1._0_4_;
        *(float *)(*pauVar9 + 4) =
             (fVar30 + fVar30 + -1.0 + (2.0 - fVar26 * (fVar30 + fVar30)) * fVar30) * auVar1._4_4_;
        *(float *)(*pauVar9 + 8) =
             (fVar31 + fVar31 + -1.0 + (2.0 - fVar27 * (fVar31 + fVar31)) * fVar31) * auVar1._8_4_;
        *(float *)(*pauVar9 + 0xc) =
             (fVar32 + fVar32 + -1.0 + (2.0 - fVar28 * (fVar32 + fVar32)) * fVar32) * auVar1._12_4_;
        pauVar9 = pauVar9 + 1;
        lVar14 = lVar14 + 4;
      }
      lVar8 = sVar5 * sVar4 * uVar7;
      for (; (int)lVar14 < (int)uVar11; lVar14 = lVar14 + 1) {
        fVar29 = *(float *)((long)pvVar3 + lVar14 * 4 + lVar8);
        fVar30 = expf(fVar29);
        fVar30 = logf(fVar30 + 1.0);
        fVar30 = tanhf(fVar30);
        *(float *)((long)pvVar3 + lVar14 * 4 + lVar8) = fVar30 * fVar29;
      }
    }
  }
  return 0;
}

Assistant:

int Mish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}